

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_Variant_setScalarCopy(UA_Variant *v,void *p,UA_DataType *type)

{
  void *dst;
  UA_StatusCode retval;
  void *n;
  UA_DataType *type_local;
  void *p_local;
  UA_Variant *v_local;
  
  dst = malloc((ulong)type->memSize);
  if (dst == (void *)0x0) {
    v_local._4_4_ = 0x80030000;
  }
  else {
    v_local._4_4_ = UA_copy(p,dst,type);
    if (v_local._4_4_ == 0) {
      UA_Variant_setScalar(v,dst,type);
      v_local._4_4_ = 0;
    }
    else {
      free(dst);
    }
  }
  return v_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Variant_setScalarCopy(UA_Variant *v, const void *p,
                         const UA_DataType *type) {
    void *n = UA_malloc(type->memSize);
    if(!n)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    UA_StatusCode retval = UA_copy(p, n, type);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_free(n);
        //cppcheck-suppress memleak
        return retval;
    }
    UA_Variant_setScalar(v, n, type);
    //cppcheck-suppress memleak
    return UA_STATUSCODE_GOOD;
}